

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int stagept)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  ostringstream os;
  undefined1 auStack_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_188);
  if ((int)this == 1) {
    lVar2 = 0x5b;
    pcVar3 = 
    "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);"
    ;
  }
  else {
    if ((int)this != 0) goto LAB_00c86439;
    lVar2 = 0x58;
    pcVar3 = 
    "\nvoid main() {\n  gl_Position = vec4(0,0,0,1);\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,pcVar3,lVar2);
LAB_00c86439:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_188,"\n}",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_188);
  psVar1 = (string *)std::ios_base::~ios_base((ios_base *)(auStack_188 + 0x70));
  return psVar1;
}

Assistant:

std::string BuildShaderPT(int stagept)
	{
		std::ostringstream os;
		if (stagept == vertex)
		{
			os << NL "void main() {" NL "  gl_Position = vec4(0,0,0,1);" NL "#ifdef GL_ES" NL
					 "  gl_PointSize = 1.0f;" NL "#endif";
		}
		if (stagept == fragment)
		{
			os << NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL
					 "  o_color = vec4(0.0, 1.0, 0.0, 1.0);";
		}
		os << NL "}";
		return os.str();
	}